

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Performance::TextureUploadCallCase::render(TextureUploadCallCase *this)

{
  UploadFunction UVar1;
  deUint32 dVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  code *pcVar6;
  int iVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar9;
  Functions *gl;
  TextureUploadCallCase *this_local;
  
  pRVar8 = gles2::Context::getRenderContext
                     ((this->super_TextureUploadCase).super_TestCase.m_context);
  iVar7 = (*pRVar8->_vptr_RenderContext[3])();
  UVar1 = (this->super_TextureUploadCase).m_uploadFunction;
  if (UVar1 == UPLOAD_TEXIMAGE2D) {
    pcVar6 = *(code **)(CONCAT44(extraout_var,iVar7) + 0x1310);
    dVar4 = (this->super_TextureUploadCase).m_format;
    iVar7 = (this->super_TextureUploadCase).m_texSize;
    iVar3 = (this->super_TextureUploadCase).m_texSize;
    dVar5 = (this->super_TextureUploadCase).m_format;
    dVar2 = (this->super_TextureUploadCase).m_type;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&(this->super_TextureUploadCase).m_texData,0);
    (*pcVar6)(0xde1,0,dVar4,iVar7,iVar3,0,dVar5,dVar2,pvVar9);
  }
  else if (UVar1 == UPLOAD_TEXSUBIMAGE2D) {
    pcVar6 = *(code **)(CONCAT44(extraout_var,iVar7) + 0x13b8);
    iVar7 = (this->super_TextureUploadCase).m_texSize;
    iVar3 = (this->super_TextureUploadCase).m_texSize;
    dVar4 = (this->super_TextureUploadCase).m_format;
    dVar5 = (this->super_TextureUploadCase).m_type;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&(this->super_TextureUploadCase).m_texData,0);
    (*pcVar6)(0xde1,0,0,0,iVar7,iVar3,dVar4,dVar5,pvVar9);
  }
  return;
}

Assistant:

void TextureUploadCallCase::render (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Draw multiple quads to ensure enough workload

	switch (m_uploadFunction)
	{
		case UPLOAD_TEXIMAGE2D:
			gl.texImage2D(GL_TEXTURE_2D, 0, m_format, m_texSize, m_texSize, 0, m_format, m_type, &m_texData[0]);
			break;
		case UPLOAD_TEXSUBIMAGE2D:
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, m_texSize, m_texSize, m_format, m_type, &m_texData[0]);
			break;
		default:
			DE_ASSERT(false);
	}
}